

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O3

void __thiscall NaPNSwapper::action(NaPNSwapper *this)

{
  bool bVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  NaVector *pNVar4;
  undefined8 extraout_RDX;
  NaPetriCnInput *this_00;
  
  pNVar3 = NaPetriCnInput::data(&this->turn);
  iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
  if (*(double *)CONCAT44(extraout_var,iVar2) <= 0.0) {
    bVar1 = NaPetriCnInput::is_waiting(&this->in2);
    if (!bVar1) {
      bVar1 = NaPetriCnOutput::is_waiting(&this->out);
      if (!bVar1) {
        pNVar3 = NaPetriCnInput::data(&this->in2);
        pNVar4 = NaPetriCnOutput::data(&this->out);
        (*pNVar4->_vptr_NaVector[2])(pNVar4,pNVar3);
      }
    }
    this_00 = &this->in;
  }
  else {
    bVar1 = NaPetriCnInput::is_waiting(&this->in);
    if (!bVar1) {
      bVar1 = NaPetriCnOutput::is_waiting(&this->out);
      if (!bVar1) {
        pNVar3 = NaPetriCnInput::data(&this->in);
        pNVar4 = NaPetriCnOutput::data(&this->out);
        (*pNVar4->_vptr_NaVector[2])(pNVar4,pNVar3);
      }
    }
    this_00 = &this->in2;
  }
  bVar1 = NaPetriCnInput::is_waiting(this_00);
  if (!bVar1) {
    bVar1 = NaPetriCnOutput::is_waiting(&this->out2);
    if (!bVar1) {
      pNVar3 = NaPetriCnInput::data(this_00);
      pNVar4 = NaPetriCnOutput::data(&this->out2);
      (*pNVar4->_vptr_NaVector[2])(pNVar4,pNVar3,extraout_RDX,pNVar4->_vptr_NaVector[2]);
      return;
    }
  }
  return;
}

Assistant:

void
NaPNSwapper::action ()
{
    if(turn.data()[0] > 0){
        // Copy input to output
        if(!in.is_waiting() && !out.is_waiting()){
            out.data() = in.data();
        }
        if(!in2.is_waiting() && !out2.is_waiting()){
            out2.data() = in2.data();
        }
    }else{
        // Copy crossed input to output
        if(!in2.is_waiting() && !out.is_waiting()){
            out.data() = in2.data();
        }
        if(!in.is_waiting() && !out2.is_waiting()){
            out2.data() = in.data();
        }
    }
}